

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

double __thiscall spdlog::logger::log(logger *this,double __x)

{
  __int_type_conflict _Var1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  int in_ESI;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  log_msg local_90;
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if ((in_ESI < iVar2 & (_Var1 ^ 1U)) == 0) {
    pcVar3 = (this->name_)._M_dataplus._M_p;
    sVar4 = (this->name_)._M_string_length;
    local_90.time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_a8 = SUB84(pcVar3,0);
    uStack_a4 = (undefined4)((ulong)pcVar3 >> 0x20);
    uStack_a0 = (undefined4)sVar4;
    uStack_9c = (undefined4)(sVar4 >> 0x20);
    local_90.logger_name.data_._0_4_ = local_a8;
    local_90.logger_name.data_._4_4_ = uStack_a4;
    local_90.logger_name.size_._0_4_ = uStack_a0;
    local_90.logger_name.size_._4_4_ = uStack_9c;
    if (*(char *)(in_FS_OFFSET + -8) == '\0') {
      local_90.thread_id = syscall(0xba);
      *(size_t *)(in_FS_OFFSET + -0x10) = local_90.thread_id;
      *(undefined1 *)(in_FS_OFFSET + -8) = 1;
    }
    else {
      local_90.thread_id = *(size_t *)(in_FS_OFFSET + -0x10);
    }
    local_90.color_range_start = 0;
    local_90.color_range_end = 0;
    if (iVar2 <= in_ESI) {
      (*this->_vptr_logger[3])(this,&local_90);
      in_stack_00000008 = extraout_XMM0_Da;
      in_stack_0000000c = extraout_XMM0_Db;
    }
    __x = (double)CONCAT44(in_stack_0000000c,in_stack_00000008);
    if ((_Var1 & 1U) != 0) {
      details::backtracer::push_back(&this->tracer_,&local_90);
      __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    }
  }
  return __x;
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t msg)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }

        details::log_msg log_msg(loc, name_, lvl, msg);
        log_it_(log_msg, log_enabled, traceback_enabled);
    }